

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O1

void Ssc_GiaResetSimInfo(Gia_Man_t *p)

{
  Vec_Wrd_t *pVVar1;
  Vec_Int_t *pVVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  int iVar5;
  ulong uVar6;
  
  pVVar1 = p->vSimsPi;
  pVVar2 = p->vCis;
  if (pVVar1->nSize % pVVar2->nSize != 0) {
    __assert_fail("Vec_WrdSize(p->vSimsPi) % Gia_ManCiNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                  ,0xf2,"void Ssc_GiaResetSimInfo(Gia_Man_t *)");
  }
  if (p->vSims == (Vec_Wrd_t *)0x0) {
    pVVar3 = (Vec_Wrd_t *)malloc(0x10);
    pVVar3->nCap = 0;
    pVVar3->nSize = 0;
    pVVar3->pArray = (word *)0x0;
    p->vSims = pVVar3;
  }
  pVVar3 = p->vSims;
  uVar6 = (long)(pVVar1->nSize / (pVVar2->nSize - p->nRegs)) * (long)p->nObjs;
  iVar5 = (int)uVar6;
  if (pVVar3->nCap < iVar5) {
    if (pVVar3->pArray == (word *)0x0) {
      pwVar4 = (word *)malloc(uVar6 * 8);
    }
    else {
      pwVar4 = (word *)realloc(pVVar3->pArray,uVar6 * 8);
    }
    pVVar3->pArray = pwVar4;
    if (pwVar4 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    pVVar3->nCap = iVar5;
  }
  if (0 < iVar5) {
    memset(pVVar3->pArray,0,(uVar6 & 0xffffffff) << 3);
  }
  pVVar3->nSize = iVar5;
  return;
}

Assistant:

void Ssc_GiaResetSimInfo( Gia_Man_t * p )
{
    assert( Vec_WrdSize(p->vSimsPi) % Gia_ManCiNum(p) == 0 );
    if ( p->vSims == NULL )
        p->vSims = Vec_WrdAlloc(0);
    Vec_WrdFill( p->vSims, Gia_ObjSimWords(p) * Gia_ManObjNum(p), 0 );
}